

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall
kj::PathPtr::clone(PathPtr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  anon_class_1_0_00000001 local_39;
  Mapper<kj::ArrayPtr<const_kj::String>_&> local_38;
  Array<kj::String> local_30;
  __fn *local_18;
  PathPtr *this_local;
  
  local_18 = __fn;
  this_local = this;
  kj::_::Mapper<kj::ArrayPtr<const_kj::String>_&>::Mapper
            (&local_38,(ArrayPtr<const_kj::String> *)__fn);
  kj::_::Mapper<kj::ArrayPtr<const_kj::String>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:49:15)>
            (&local_30,&local_38,&local_39);
  Path::Path((Path *)this,&local_30,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_30);
  return (int)this;
}

Assistant:

Path PathPtr::clone() {
  return Path(KJ_MAP(p, parts) { return heapString(p); }, Path::ALREADY_CHECKED);
}